

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_resolve.cpp
# Opt level: O1

bool __thiscall
BamTools::ResolveTool::StatsFileReader::Read
          (StatsFileReader *this,ResolveSettings *settings,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
          *readGroups)

{
  char cVar1;
  bool bVar2;
  string *this_00;
  int iVar3;
  bool bVar4;
  string line;
  string local_70;
  string local_50;
  
  cVar1 = std::__basic_file<char>::is_open();
  iVar3 = 0;
  bVar4 = false;
  if (settings != (ResolveSettings *)0x0 && cVar1 == '\x01') {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ReadGroupResolver>_>_>
    ::clear(&readGroups->_M_t);
    SkipCommentsAndWhitespace_abi_cxx11_(&local_70,this);
    while (bVar4 = local_70._M_string_length == 0, !bVar4) {
      bVar2 = Utilities::StartsWith(&local_70,&INPUT_TOKEN_abi_cxx11_);
      if (bVar2) {
        iVar3 = 1;
LAB_00168f36:
        bVar2 = false;
      }
      else {
        bVar2 = Utilities::StartsWith(&local_70,&OPTIONS_TOKEN_abi_cxx11_);
        if (bVar2) {
          bVar2 = false;
LAB_00168f51:
          iVar3 = 2;
        }
        else {
          this_00 = &local_70;
          bVar2 = Utilities::StartsWith(&local_70,&READGROUPS_TOKEN_abi_cxx11_);
          if (bVar2) {
            bVar2 = false;
          }
          else {
            if (iVar3 != 3) {
              if (iVar3 != 2) {
                bVar2 = true;
                if (iVar3 == 1) goto LAB_00168f36;
                goto LAB_00168f75;
              }
              bVar2 = ParseOptionLine((StatsFileReader *)this_00,&local_70,settings);
              bVar2 = !bVar2;
              goto LAB_00168f51;
            }
            bVar2 = ParseReadGroupLine((StatsFileReader *)this_00,&local_70,readGroups);
            bVar2 = !bVar2;
          }
          iVar3 = 3;
        }
      }
LAB_00168f75:
      if (bVar2) break;
      SkipCommentsAndWhitespace_abi_cxx11_(&local_50,this);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  return bVar4;
}

Assistant:

bool ResolveTool::StatsFileReader::Read(ResolveTool::ResolveSettings* settings,
                                        std::map<std::string, ReadGroupResolver>& readGroups)
{
    // up-front sanity checks
    if (!m_stream.is_open() || settings == 0) return false;

    // clear out read group data
    readGroups.clear();

    // initialize state
    State currentState = StatsFileReader::None;

    // read stats file
    std::string line = SkipCommentsAndWhitespace();
    while (!line.empty()) {

        bool foundError = false;

        // switch state on keyword found
        if (Utilities::StartsWith(line, INPUT_TOKEN))
            currentState = StatsFileReader::InInput;
        else if (Utilities::StartsWith(line, OPTIONS_TOKEN))
            currentState = StatsFileReader::InOptions;
        else if (Utilities::StartsWith(line, READGROUPS_TOKEN))
            currentState = StatsFileReader::InReadGroups;

        // otherwise parse data line, depending on state
        else {
            if (currentState == StatsFileReader::InInput)
                foundError = !ParseInputLine(line);
            else if (currentState == StatsFileReader::InOptions)
                foundError = !ParseOptionLine(line, settings);
            else if (currentState == StatsFileReader::InReadGroups)
                foundError = !ParseReadGroupLine(line, readGroups);
            else
                foundError = true;
        }

        // break out if error found
        if (foundError) return false;

        // get next line
        line = SkipCommentsAndWhitespace();
    }

    // if here, return success
    return true;
}